

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O3

void __thiscall QNetworkRequestPrivate::~QNetworkRequestPrivate(QNetworkRequestPrivate *this)

{
  QSslConfiguration *this_00;
  Data *pDVar1;
  Data *pDVar2;
  
  this_00 = this->sslConfiguration;
  if (this_00 != (QSslConfiguration *)0x0) {
    QSslConfiguration::~QSslConfiguration(this_00);
  }
  operator_delete(this_00,8);
  QHttp2Configuration::~QHttp2Configuration(&this->h2Configuration);
  QHttp1Configuration::~QHttp1Configuration(&this->h1Configuration);
  pDVar1 = (this->peerVerifyName).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->peerVerifyName).d.d)->super_QArrayData,2,0x10);
    }
  }
  QUrl::~QUrl(&this->url);
  pDVar2 = (this->super_QNetworkHeadersPrivate).originatingObject.wp.d;
  if (pDVar2 != (Data *)0x0) {
    LOCK();
    (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i =
         (pDVar2->weakref)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar2->weakref)._q_value.super___atomic_base<int>._M_i == 0) {
      pDVar2 = (this->super_QNetworkHeadersPrivate).originatingObject.wp.d;
      if (pDVar2 == (Data *)0x0) {
        pDVar2 = (Data *)0x0;
      }
      operator_delete(pDVar2);
    }
  }
  QHash<QNetworkRequest::Attribute,_QVariant>::~QHash
            (&(this->super_QNetworkHeadersPrivate).attributes);
  QHash<QNetworkRequest::KnownHeaders,_QVariant>::~QHash
            (&(this->super_QNetworkHeadersPrivate).cookedHeaders);
  QHttpHeaders::~QHttpHeaders(&(this->super_QNetworkHeadersPrivate).httpHeaders);
  QArrayDataPointer<std::pair<QByteArray,_QByteArray>_>::~QArrayDataPointer
            ((QArrayDataPointer<std::pair<QByteArray,_QByteArray>_> *)
             &this->super_QNetworkHeadersPrivate);
  return;
}

Assistant:

~QNetworkRequestPrivate()
    {
#ifndef QT_NO_SSL
        delete sslConfiguration;
#endif
    }